

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_rust_punycode.cc
# Opt level: O2

Nullable<char_*>
absl::lts_20250127::debugging_internal::DecodeRustPunycode(DecodeRustPunycodeOptions options)

{
  byte bVar1;
  char cVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  char *pcVar5;
  ulong uVar6;
  uint32_t index;
  ulong code_point;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  Nullable<char_*> pcVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  char *pcVar17;
  ulong local_a8;
  Utf8ForCodePoint utf8_for_code_point;
  BoundedUtf8LengthSequence<256U> utf8_lengths;
  
  if (options.out_end == options.out_begin) {
LAB_0028639d:
    pcVar11 = (Nullable<char_*>)0x0;
  }
  else {
    *options.out_begin = '\0';
    pcVar17 = options.punycode_end + -(long)options.punycode_begin;
    if ((long)(options.punycode_end + -(long)options.punycode_begin) < 1) {
      pcVar17 = (char *)0x0;
    }
    uVar16 = 0xffffffffffffffff;
    for (pcVar5 = (char *)0x0; pcVar17 != pcVar5; pcVar5 = pcVar5 + 1) {
      bVar1 = options.punycode_begin[(long)pcVar5];
      if (bVar1 == 0x5f) {
        uVar16 = (ulong)pcVar5 & 0xffffffff;
      }
      else if ((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) {
        return (Nullable<char_*>)0x0;
      }
    }
    iVar7 = (int)uVar16;
    if (iVar7 < 0) {
      uVar16 = 0;
    }
    else {
      if ((iVar7 == 0) ||
         ((long)options.out_end - (long)options.out_begin < (long)(ulong)(iVar7 + 1)))
      goto LAB_0028639d;
      memcpy(options.out_begin,options.punycode_begin,uVar16 & 0xffffffff);
      options.out_begin[uVar16 & 0xffffffff] = '\0';
      options.punycode_begin = options.punycode_begin + (iVar7 + 1);
    }
    utf8_lengths.rep_[6] = 0;
    utf8_lengths.rep_[7] = 0;
    utf8_lengths.rep_[4] = 0;
    utf8_lengths.rep_[5] = 0;
    utf8_lengths.rep_[2] = 0;
    utf8_lengths.rep_[3] = 0;
    utf8_lengths.rep_[0] = 0;
    utf8_lengths.rep_[1] = 0;
    iVar7 = 0x48;
    code_point = 0x80;
    uVar9 = 0;
    local_a8 = uVar16 & 0xffffffff;
    while( true ) {
      lVar15 = 1;
      if (options.punycode_begin == options.punycode_end) break;
      if (0xff < (uint)uVar16) {
        return (Nullable<char_*>)0x0;
      }
      uVar6 = (ulong)uVar9;
      uVar8 = 0x24;
      while( true ) {
        if (options.punycode_begin == options.punycode_end) {
          return (Nullable<char_*>)0x0;
        }
        cVar2 = *options.punycode_begin;
        iVar12 = (int)cVar2;
        if ((byte)(cVar2 - 0x30U) < 10) {
          uVar13 = iVar12 - 0x16;
        }
        else if ((byte)(cVar2 + 0x9fU) < 0x1a) {
          uVar13 = iVar12 - 0x61;
        }
        else {
          if (0x19 < (byte)(cVar2 + 0xbfU)) {
            return (Nullable<char_*>)0x0;
          }
          uVar13 = iVar12 - 0x41;
        }
        if ((int)uVar13 < 0) {
          return (Nullable<char_*>)0x0;
        }
        uVar6 = (ulong)uVar13 * lVar15 + (uVar6 & 0xffffffff);
        if (0x40000000 < uVar6) {
          return (Nullable<char_*>)0x0;
        }
        uVar14 = uVar8 - iVar7;
        if (iVar7 + 0x1aU <= uVar8) {
          uVar14 = 0x1a;
        }
        if (uVar8 <= iVar7 + 1U) {
          uVar14 = 1;
        }
        if (uVar13 < uVar14) break;
        options.punycode_begin = options.punycode_begin + 1;
        lVar15 = lVar15 * (ulong)(0x24 - uVar14);
        uVar8 = uVar8 + 0x24;
      }
      uVar10 = 2;
      if (uVar9 == 0) {
        uVar10 = 700;
      }
      iVar7 = 0;
      uVar10 = ((int)uVar6 - uVar9) / uVar10;
      uVar16 = (ulong)((uint)uVar16 + 1);
      options.punycode_begin = options.punycode_begin + 1;
      for (uVar9 = (int)(uVar10 / uVar16) + (int)uVar10; 0x1c7 < uVar9; uVar9 = uVar9 / 0x23) {
        iVar7 = iVar7 + 0x24;
      }
      index = (uint32_t)((uVar6 & 0xffffffff) % uVar16);
      code_point = (ulong)(uint)((int)code_point + (int)((uVar6 & 0xffffffff) / uVar16));
      Utf8ForCodePoint::Utf8ForCodePoint(&utf8_for_code_point,code_point);
      if ((utf8_for_code_point.length == 0) ||
         ((ulong)((long)options.out_end - (long)options.out_begin) <
          (ulong)((int)local_a8 + utf8_for_code_point.length + 1))) goto LAB_0028639d;
      iVar7 = iVar7 + (uVar9 * 0x24 & 0xffff) / (uVar9 + 0x26 & 0xffff);
      uVar4 = BoundedUtf8LengthSequence<256U>::InsertAndReturnSumOfPredecessors
                        (&utf8_lengths,index,utf8_for_code_point.length);
      uVar3 = utf8_for_code_point.length;
      pcVar17 = options.out_begin + uVar4;
      uVar6 = (ulong)utf8_for_code_point.length;
      memmove(pcVar17 + uVar6,pcVar17,(ulong)(((int)local_a8 + 1) - uVar4));
      memcpy(pcVar17,&utf8_for_code_point,uVar6);
      local_a8 = (ulong)((int)local_a8 + uVar3);
      uVar9 = index + 1;
    }
    pcVar11 = options.out_begin + local_a8;
  }
  return pcVar11;
}

Assistant:

absl::Nullable<char*> DecodeRustPunycode(DecodeRustPunycodeOptions options) {
  const char* punycode_begin = options.punycode_begin;
  const char* const punycode_end = options.punycode_end;
  char* const out_begin = options.out_begin;
  char* const out_end = options.out_end;

  // Write a NUL terminator first.  Later memcpy calls will keep bumping it
  // along to its new right place.
  const size_t out_size = static_cast<size_t>(out_end - out_begin);
  if (out_size == 0) return nullptr;
  *out_begin = '\0';

  // RFC 3492 section 6.2 begins here.  We retain the names of integer variables
  // appearing in that text.
  uint32_t n = 128, i = 0, bias = 72, num_chars = 0;

  // If there are any ASCII characters, consume them and their trailing
  // underscore delimiter.
  if (!ConsumeOptionalAsciiPrefix(punycode_begin, punycode_end,
                                  out_begin, out_end, num_chars)) {
    return nullptr;
  }
  uint32_t total_utf8_bytes = num_chars;

  BoundedUtf8LengthSequence<kMaxChars> utf8_lengths;

  // "while the input is not exhausted do begin ... end"
  while (punycode_begin != punycode_end) {
    if (num_chars >= kMaxChars) return nullptr;

    const uint32_t old_i = i;

    if (!ScanNextDelta(punycode_begin, punycode_end, bias, i)) return nullptr;

    // Update bias as in RFC 3492 section 6.1.  (We have inlined adapt.)
    uint32_t delta = i - old_i;
    delta /= (old_i == 0 ? kDamp : 2);
    delta += delta/(num_chars + 1);
    bias = 0;
    while (delta > ((kBase - kTMin) * kTMax)/2) {
      delta /= kBase - kTMin;
      bias += kBase;
    }
    bias += ((kBase - kTMin + 1) * delta)/(delta + kSkew);

    // Back in section 6.2, compute the new code point and insertion index.
    static_assert(
        kMaxI + kMaxCodePoint < (uint64_t{1} << 32),
        "Make kMaxI smaller or n 64 bits wide to prevent silent wraparound");
    n += i/(num_chars + 1);
    i %= num_chars + 1;

    // To actually insert, we need to convert the code point n to UTF-8 and the
    // character index i to an index into the byte stream emitted so far.  First
    // prepare the UTF-8 encoding for n, rejecting surrogates, overlarge values,
    // and anything that won't fit into the remaining output storage.
    Utf8ForCodePoint utf8_for_code_point(n);
    if (!utf8_for_code_point.ok()) return nullptr;
    if (total_utf8_bytes + utf8_for_code_point.length + 1 > out_size) {
      return nullptr;
    }

    // Now insert the new character into both our length map and the output.
    uint32_t n_index =
        utf8_lengths.InsertAndReturnSumOfPredecessors(
            i, utf8_for_code_point.length);
    std::memmove(
        out_begin + n_index + utf8_for_code_point.length, out_begin + n_index,
        total_utf8_bytes + 1 - n_index);
    std::memcpy(out_begin + n_index, utf8_for_code_point.bytes,
                utf8_for_code_point.length);
    total_utf8_bytes += utf8_for_code_point.length;
    ++num_chars;

    // Finally, advance to the next state before continuing.
    ++i;
  }

  return out_begin + total_utf8_bytes;
}